

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-ipv6.c
# Opt level: O0

int run_test_udp_ipv6_only(void)

{
  int iVar1;
  int local_c;
  
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    fprintf(_stderr,"%s\n","IPv6 not supported");
    fflush(_stderr);
    local_c = 1;
  }
  else {
    do_test(ipv6_recv_fail,1);
    if (recv_cb_called != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-ipv6.c"
              ,0xf7,"recv_cb_called == 0");
      abort();
    }
    if (send_cb_called != 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-ipv6.c"
              ,0xf8,"send_cb_called == 1");
      abort();
    }
    local_c = 0;
  }
  return local_c;
}

Assistant:

TEST_IMPL(udp_ipv6_only) {
  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  do_test(ipv6_recv_fail, UV_UDP_IPV6ONLY);

  ASSERT(recv_cb_called == 0);
  ASSERT(send_cb_called == 1);

  return 0;
}